

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaJsonWriter::WriteNumber(VmaJsonWriter *this,uint32_t n)

{
  BeginValue(this,false);
  VmaStringBuilder::AddNumber(this->m_SB,n);
  return;
}

Assistant:

void VmaJsonWriter::WriteNumber(uint32_t n)
{
    VMA_ASSERT(!m_InsideString);
    BeginValue(false);
    m_SB.AddNumber(n);
}